

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmfilnam.cpp
# Opt level: O2

int __thiscall
CVmObjFileName::getp_getFileType(CVmObjFileName *this,vm_obj_id_t self,vm_val_t *retval,uint *oargc)

{
  vm_datatype_t vVar1;
  err_frame_t *peVar2;
  CVmException *pCVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  CVmNetFile *this_00;
  undefined8 *puVar7;
  long *plVar8;
  uint uVar9;
  unsigned_long osmode;
  unsigned_long osattr;
  err_frame_t err_cur__;
  vm_rcdesc rc;
  
  if (oargc == (uint *)0x0) {
    uVar9 = 0;
  }
  else {
    uVar9 = *oargc;
  }
  if ((getp_getFileType(unsigned_int,vm_val_t*,unsigned_int*)::desc == '\0') &&
     (iVar4 = __cxa_guard_acquire(&getp_getFileType(unsigned_int,vm_val_t*,unsigned_int*)::desc),
     iVar4 != 0)) {
    getp_getFileType::desc.min_argc_ = 0;
    getp_getFileType::desc.opt_argc_ = 0;
    getp_getFileType::desc.varargs_ = 0;
    __cxa_guard_release(&getp_getFileType(unsigned_int,vm_val_t*,unsigned_int*)::desc);
  }
  iVar4 = CVmObject::get_prop_check_argc(retval,oargc,&getp_getFileType::desc);
  if (iVar4 == 0) {
    CVmMetaclass::get_class_obj(metaclass_reg_);
    vm_rcdesc::init(&rc,(EVP_PKEY_CTX *)"FileName.getFileType");
    this_00 = CVmObjFile::get_filename_from_obj(self,&rc,0x1001,0xb,"application/octet-stream");
    if (uVar9 == 0) {
      uVar5 = 1;
    }
    else {
      if (sp_[-1].typ - VM_STACK < 0xfffffffe) {
        err_throw(0x902);
      }
      uVar5 = (uint)(sp_[-1].typ != VM_TRUE);
    }
    puVar7 = (undefined8 *)_ZTW11G_err_frame();
    err_cur__.prv_ = (err_frame_t *)*puVar7;
    plVar8 = (long *)_ZTW11G_err_frame();
    *plVar8 = (long)&err_cur__;
    err_cur__.state_ = _setjmp((__jmp_buf_tag *)err_cur__.jmpbuf_);
    if (err_cur__.state_ == 0) {
      iVar4 = CVmNetFile::get_file_mode(this_00,&osmode,&osattr,uVar5);
      uVar5 = (uint)(iVar4 == 0);
    }
    if (-1 < (short)err_cur__.state_) {
      err_cur__.state_ = err_cur__.state_ | 0x8000;
      CVmNetFile::abandon(this_00);
    }
    peVar2 = err_cur__.prv_;
    puVar7 = (undefined8 *)_ZTW11G_err_frame();
    *puVar7 = peVar2;
    if ((err_cur__.state_ & 0x4001U) != 0) {
      puVar7 = (undefined8 *)_ZTW11G_err_frame();
      if ((*(byte *)*puVar7 & 2) != 0) {
        plVar8 = (long *)_ZTW11G_err_frame();
        free(*(void **)(*plVar8 + 0x10));
      }
      pCVar3 = err_cur__.exc_;
      plVar8 = (long *)_ZTW11G_err_frame();
      *(CVmException **)(*plVar8 + 0x10) = pCVar3;
      err_rethrow();
    }
    if ((err_cur__.state_ & 2U) != 0) {
      free(err_cur__.exc_);
    }
    if (uVar5 == 0) {
      uVar5 = filemode_to_filetype((int)osmode);
      uVar6 = special_filetype_flags(this);
      (retval->val).obj = uVar6 | uVar5;
      vVar1 = VM_INT;
    }
    else {
      vVar1 = VM_NIL;
    }
    retval->typ = vVar1;
    sp_ = sp_ + -(long)(int)uVar9;
  }
  return 1;
}

Assistant:

int CVmObjFileName::getp_getFileType(VMG_ vm_obj_id_t self,
                                     vm_val_t *retval, uint *oargc)
{
    /* check arguments */
    uint argc = (oargc != 0 ? *oargc : 0);
    static CVmNativeCodeDesc desc(0);
    if (get_prop_check_argc(retval, oargc, &desc))
        return TRUE;

    /* get the filename; use the GETINFO access mode */
    vm_rcdesc rc(vmg_ "FileName.getFileType",
                 metaclass_reg_->get_class_obj(vmg0_),
                 VMOFN_GETFILETYPE, G_stk->get(0), argc);
    CVmNetFile *netfile = CVmObjFile::get_filename_from_obj(
        vmg_ self, &rc, VMOBJFILE_ACCESS_GETINFO,
        OSFTUNK, "application/octet-stream");

    /* check to see if we're following links (follow them by default) */
    int follow_links = TRUE;
    if (argc >= 1)
    {
        /* 
         *   note that our 'asLink' parameter has the opposite sense from
         *   'follow_links', so invert the parameter value 
         */
        follow_links = !G_stk->get(0)->get_logical();
        if (!G_stk->get(0)->is_logical())
            err_throw(VMERR_BAD_VAL_BIF);
    }

    int ok;
    unsigned long osmode, osattr;
    err_try
    {
        /* get the file type from the netfile object */
        ok = netfile->get_file_mode(vmg_ &osmode, &osattr, follow_links);
    }